

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::XmlReporter::EndTesting(XmlReporter *this,Totals *totals)

{
  ScopedElement *this_00;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40 [32];
  pointer local_18;
  Totals *totals_local;
  XmlReporter *this_local;
  
  local_18 = (pointer)totals;
  totals_local = (Totals *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"OverallResults",&local_41);
  XmlWriter::scopedElement((XmlWriter *)&stack0xffffffffffffffe0,(string *)&this->m_xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"successes",&local_79);
  this_00 = XmlWriter::ScopedElement::writeAttribute<unsigned_long>
                      ((ScopedElement *)&stack0xffffffffffffffe0,&local_78,(unsigned_long *)local_18
                      );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"failures",&local_a1);
  XmlWriter::ScopedElement::writeAttribute<unsigned_long>
            (this_00,&local_a0,&local_18->_M_string_length);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&stack0xffffffffffffffe0);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  XmlWriter::endElement(&this->m_xml);
  return;
}

Assistant:

virtual void EndTesting( const Totals& totals ) {
            m_xml.scopedElement( "OverallResults" )
                .writeAttribute( "successes", totals.assertions.passed )
                .writeAttribute( "failures", totals.assertions.failed );
            m_xml.endElement();
        }